

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::mouseReleaseEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  Representation RVar1;
  MouseButton MVar2;
  Operation OVar3;
  SubControl SVar4;
  int iVar5;
  int iVar6;
  QObject *pQVar7;
  QMdiSubWindowPrivate *pQVar8;
  QRect *pQVar9;
  QSinglePointEvent *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *d;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QWidget *in_stack_ffffffffffffff90;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff98;
  QMdiSubWindowPrivate *rgn;
  QRegion local_40;
  QPointF local_38;
  QPoint local_28;
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = QObject::parent((QObject *)0x6363bf);
  if (pQVar7 == (QObject *)0x0) {
    QWidget::mouseReleaseEvent
              (in_stack_ffffffffffffff90,
               (QMouseEvent *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  else {
    MVar2 = QSinglePointEvent::button(in_RSI);
    if (MVar2 == LeftButton) {
      pQVar8 = d_func((QMdiSubWindow *)0x636401);
      if (pQVar8->currentOperation != None) {
        if (((pQVar8->isInRubberBandMode & 1U) != 0) && ((pQVar8->isInInteractiveMode & 1U) == 0)) {
          QMdiSubWindowPrivate::leaveRubberBandMode(in_RDI);
        }
        if (((pQVar8->resizeEnabled & 1U) != 0) || ((pQVar8->moveEnabled & 1U) != 0)) {
          pQVar9 = QWidget::geometry((QWidget *)in_RDI);
          RVar1.m_i = (pQVar9->y1).m_i;
          (pQVar8->oldGeometry).x1 = (Representation)(pQVar9->x1).m_i;
          (pQVar8->oldGeometry).y1 = (Representation)RVar1.m_i;
          RVar1.m_i = (pQVar9->y2).m_i;
          (pQVar8->oldGeometry).x2 = (Representation)(pQVar9->x2).m_i;
          (pQVar8->oldGeometry).y2 = (Representation)RVar1.m_i;
        }
      }
      rgn = pQVar8;
      local_20 = QSinglePointEvent::position((QSinglePointEvent *)0x636493);
      local_10 = QPointF::toPoint((QPointF *)in_RDI);
      OVar3 = QMdiSubWindowPrivate::getOperation(in_stack_ffffffffffffff98,(QPoint *)pQVar8);
      rgn->currentOperation = OVar3;
      QMdiSubWindowPrivate::updateCursor(in_RDI);
      pQVar8 = rgn;
      local_38 = QSinglePointEvent::position((QSinglePointEvent *)0x6364e8);
      local_28 = QPointF::toPoint((QPointF *)in_RDI);
      SVar4 = QMdiSubWindowPrivate::getSubControl(pQVar8,(QPoint *)in_RDI);
      pQVar8->hoveredSubControl = SVar4;
      if ((pQVar8->activeSubControl != SC_None) &&
         (pQVar8->activeSubControl == pQVar8->hoveredSubControl)) {
        QMdiSubWindowPrivate::processClickedSubControl(in_RDI);
      }
      pQVar8->activeSubControl = SC_None;
      iVar5 = QWidget::width((QWidget *)0x636568);
      iVar6 = QMdiSubWindowPrivate::titleBarHeight(pQVar8);
      QRegion::QRegion(&local_40,0,0,iVar5,iVar6,Rectangle);
      QWidget::update((QWidget *)in_RDI,(QRegion *)rgn);
      QRegion::~QRegion(&local_40);
    }
    else {
      QEvent::ignore((QEvent *)in_RSI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::mouseReleaseEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mouseReleaseEvent(mouseEvent);
        return;
    }

    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }

    Q_D(QMdiSubWindow);
    if (d->currentOperation != QMdiSubWindowPrivate::None) {
#if QT_CONFIG(rubberband)
        if (d->isInRubberBandMode && !d->isInInteractiveMode)
            d->leaveRubberBandMode();
#endif
        if (d->resizeEnabled || d->moveEnabled)
            d->oldGeometry = geometry();
    }

    d->currentOperation = d->getOperation(mouseEvent->position().toPoint());
    d->updateCursor();

    d->hoveredSubControl = d->getSubControl(mouseEvent->position().toPoint());
    if (d->activeSubControl != QStyle::SC_None
            && d->activeSubControl == d->hoveredSubControl) {
        d->processClickedSubControl();
    }
    d->activeSubControl = QStyle::SC_None;
    update(QRegion(0, 0, width(), d->titleBarHeight()));
}